

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

bool __thiscall
stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>::executeCycle
          (Microthread<implementations::scheme::SchemeImplementation> *this)

{
  element_type *this_00;
  bool bVar1;
  Microthread<implementations::scheme::SchemeImplementation> *this_local;
  
  bVar1 = (this->sleeping & 1U) == 0;
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<implementations::scheme::SchemeImplementation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<implementations::scheme::SchemeImplementation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->impl);
    Implementation<implementations::scheme::environment,_implementations::scheme::SchemeFrame>::
    execute(&this_00->
             super_Implementation<implementations::scheme::environment,_implementations::scheme::SchemeFrame>
           );
  }
  return bVar1;
}

Assistant:

bool executeCycle() {
				if (sleeping) {
					//std::cerr << "executeCycle() abort due to sleeping" << std::endl;
					return false;
				}
				//return
				impl->execute();
				return true;
			}